

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcHalfSpaceSolid::~IfcHalfSpaceSolid(IfcHalfSpaceSolid *this)

{
  ~IfcHalfSpaceSolid((IfcHalfSpaceSolid *)((long)&this[-1].AgreementFlag.field_2 + 8));
  return;
}

Assistant:

IfcHalfSpaceSolid() : Object("IfcHalfSpaceSolid") {}